

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::addMapPointer(CLIntercept *this,void *ptr,cl_map_flags flags,size_t size)

{
  iterator iVar1;
  mapped_type *pmVar2;
  double __x;
  allocator local_51;
  void *local_50;
  string local_48 [32];
  
  if (ptr != (void *)0x0) {
    local_50 = ptr;
    std::mutex::lock(&this->m_Mutex);
    iVar1 = std::
            _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
            ::find(&(this->m_MapPointerInfoMap)._M_t,&local_50);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header) {
      pmVar2 = std::
               map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
               ::operator[](&this->m_MapPointerInfoMap,&local_50);
      pmVar2->Flags = flags;
      pmVar2->Size = size;
    }
    else {
      __x = (double)std::__cxx11::string::string
                              (local_48,"Ignoring duplicate mapped pointer.\n",&local_51);
      log(this,__x);
      std::__cxx11::string::~string(local_48);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  }
  return;
}

Assistant:

void CLIntercept::addMapPointer(
    const void* ptr,
    const cl_map_flags flags,
    const size_t size )
{
    if( ptr )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_MapPointerInfoMap.find(ptr) != m_MapPointerInfoMap.end() )
        {
            log( "Ignoring duplicate mapped pointer.\n" );
        }
        else
        {
            SMapPointerInfo&    mapPointerInfo = m_MapPointerInfoMap[ptr];

            mapPointerInfo.Flags = flags;
            mapPointerInfo.Size = size;
        }
    }
}